

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qfiledialog.cpp
# Opt level: O2

void __thiscall QFileDialogPrivate::useNameFilter(QFileDialogPrivate *this,int index)

{
  int iVar1;
  AcceptMode AVar2;
  QAbstractItemModel *pQVar3;
  undefined1 *puVar4;
  long in_FS_OFFSET;
  QFileInfo local_100 [8];
  QArrayDataPointer<char16_t> local_f8;
  QArrayDataPointer<char16_t> local_d8;
  Data *local_b8;
  char16_t *pcStack_b0;
  totally_ordered_wrapper<const_QAbstractItemModel_*> local_a8;
  QArrayDataPointer<QString> local_98;
  QArrayDataPointer<QString> local_78;
  anon_union_24_3_e3d07ef4_for_data local_58;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  local_78.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
  local_78.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
  local_78.ptr = (QString *)&DAT_aaaaaaaaaaaaaaaa;
  QFileDialogOptions::nameFilters();
  puVar4 = (undefined1 *)(long)index;
  if ((undefined1 *)local_78.size == puVar4) {
    pQVar3 = QComboBox::model(((this->qFileDialogUi).d)->fileTypeCombo);
    local_d8.d = (Data *)0xffffffffffffffff;
    local_d8.ptr = (char16_t *)0x0;
    local_d8.size = 0;
    iVar1 = (**(code **)(*(long *)pQVar3 + 0x78))(pQVar3);
    local_f8.d = (Data *)0xffffffffffffffff;
    local_f8.ptr = (char16_t *)0x0;
    local_f8.size = 0;
    (**(code **)(*(long *)pQVar3 + 0x60))((QModelIndex *)&local_b8,pQVar3,iVar1 + -1,0);
    QModelIndex::data((QVariant *)&local_58,(QModelIndex *)&local_b8,0);
    ::QVariant::toString();
    QList<QString>::emplaceBack<QString>((QList<QString> *)&local_78,(QString *)&local_98);
    QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_98);
    ::QVariant::~QVariant((QVariant *)&local_58);
    QFileDialogOptions::setNameFilters((QList_conflict *)(this->options).value.ptr);
  }
  local_58.shared = (PrivateShared *)local_78.ptr[(long)puVar4].d.d;
  local_58._8_8_ = local_78.ptr[(long)puVar4].d.ptr;
  local_58._16_8_ = local_78.ptr[(long)puVar4].d.size;
  if (local_58.shared != (PrivateShared *)0x0) {
    LOCK();
    *(int *)local_58.shared = *(int *)local_58.shared + 1;
    UNLOCK();
  }
  local_98.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
  local_98.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
  local_98.ptr = (QString *)&DAT_aaaaaaaaaaaaaaaa;
  QPlatformFileDialogHelper::cleanFilterList((QString *)&local_98);
  AVar2 = QFileDialog::acceptMode
                    (*(QFileDialog **)&(this->super_QDialogPrivate).super_QWidgetPrivate.field_0x8);
  if (AVar2 == AcceptSave) {
    local_a8.ptr = (QAbstractItemModel *)0x0;
    local_b8 = (Data *)0x0;
    pcStack_b0 = (char16_t *)0x0;
    if ((undefined1 *)local_98.size == (undefined1 *)0x0) {
      pQVar3 = (QAbstractItemModel *)0x0;
    }
    else {
      QFileInfo::QFileInfo((QFileInfo *)&local_f8,(QString *)local_98.ptr);
      QFileInfo::suffix();
      pQVar3 = (QAbstractItemModel *)local_d8.size;
      pcStack_b0 = local_d8.ptr;
      local_b8 = local_d8.d;
      local_d8.d = (Data *)0x0;
      local_d8.ptr = (char16_t *)0x0;
      local_a8.ptr = (QAbstractItemModel *)local_d8.size;
      local_d8.size = 0;
      QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_d8);
      QFileInfo::~QFileInfo((QFileInfo *)&local_f8);
    }
    local_d8.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
    local_d8.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
    local_d8.ptr = (char16_t *)&DAT_aaaaaaaaaaaaaaaa;
    QLineEdit::text((QString *)&local_d8,&((this->qFileDialogUi).d)->fileNameEdit->super_QLineEdit);
    local_f8.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
    local_f8.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
    local_f8.ptr = (char16_t *)&DAT_aaaaaaaaaaaaaaaa;
    QFileInfo::QFileInfo(local_100,(QString *)&local_d8);
    QFileInfo::suffix();
    QFileInfo::~QFileInfo(local_100);
    if (((QString *)local_f8.size != (QString *)0x0) && (pQVar3 != (QAbstractItemModel *)0x0)) {
      QString::replace((longlong)&local_d8,local_d8.size - local_f8.size,(QString *)local_f8.size);
      QAbstractItemView::clearSelection((QAbstractItemView *)((this->qFileDialogUi).d)->listView);
      QLineEdit::setText(&((this->qFileDialogUi).d)->fileNameEdit->super_QLineEdit,
                         (QString *)&local_d8);
    }
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_f8);
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_d8);
    QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_b8);
  }
  QFileSystemModel::setNameFilters((QList_conflict *)this->model);
  QArrayDataPointer<QString>::~QArrayDataPointer(&local_98);
  QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_58);
  QArrayDataPointer<QString>::~QArrayDataPointer(&local_78);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QFileDialogPrivate::useNameFilter(int index)
{
    QStringList nameFilters = options->nameFilters();
    if (index == nameFilters.size()) {
        QAbstractItemModel *comboModel = qFileDialogUi->fileTypeCombo->model();
        nameFilters.append(comboModel->index(comboModel->rowCount() - 1, 0).data().toString());
        options->setNameFilters(nameFilters);
    }

    QString nameFilter = nameFilters.at(index);
    QStringList newNameFilters = QPlatformFileDialogHelper::cleanFilterList(nameFilter);
    if (q_func()->acceptMode() == QFileDialog::AcceptSave) {
        QString newNameFilterExtension;
        if (newNameFilters.size() > 0)
            newNameFilterExtension = QFileInfo(newNameFilters.at(0)).suffix();

        QString fileName = lineEdit()->text();
        const QString fileNameExtension = QFileInfo(fileName).suffix();
        if (!fileNameExtension.isEmpty() && !newNameFilterExtension.isEmpty()) {
            const qsizetype fileNameExtensionLength = fileNameExtension.size();
            fileName.replace(fileName.size() - fileNameExtensionLength,
                             fileNameExtensionLength, newNameFilterExtension);
            qFileDialogUi->listView->clearSelection();
            lineEdit()->setText(fileName);
        }
    }

    model->setNameFilters(newNameFilters);
}